

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O0

void squall::detail::check_argument_type<(squall::detail::FetchContext)4>
               (HSQUIRRELVM vm,SQInteger index,SQObjectType t)

{
  squirrel_error *this;
  SQInteger in_stack_fffffffffffffed8;
  HSQUIRRELVM in_stack_fffffffffffffee0;
  squall local_110 [32];
  squall local_f0 [48];
  char local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  SQObjectType local_20;
  SQObjectType local_1c;
  SQObjectType at;
  SQObjectType t_local;
  SQInteger index_local;
  HSQUIRRELVM vm_local;
  
  local_1c = t;
  _at = index;
  index_local = (SQInteger)vm;
  local_20 = sq_gettype(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (local_20 != local_1c) {
    this = (squirrel_error *)__cxa_allocate_exception(0x10);
    fetch_context_string<(squall::detail::FetchContext)4>();
    std::operator+(local_a0,local_c0);
    get_type_text_abi_cxx11_(local_f0,local_1c);
    std::operator+(local_80,local_a0);
    std::operator+(local_60,(char *)local_80);
    get_type_text_abi_cxx11_(local_110,local_20);
    std::operator+(local_40,local_60);
    squirrel_error::squirrel_error(this,local_40);
    __cxa_throw(this,&squirrel_error::typeinfo,squirrel_error::~squirrel_error);
  }
  return;
}

Assistant:

void check_argument_type(HSQUIRRELVM vm, SQInteger index, SQObjectType t) {
    SQObjectType at = sq_gettype(vm, index);
    if (at != t) {
        throw squirrel_error(
            fetch_context_string<FC>() + _SC(" must be ") + get_type_text(t) +
            _SC(", actual value is ") + get_type_text(at));
    }
}